

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::xyResolution
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,
          double xPos_mm,double yPos_mm,double A_top)

{
  pointer pdVar1;
  RandomGen *pRVar2;
  ostream *poVar3;
  ulong uVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,2,(allocator_type *)&local_28);
  (*this->fdetector->_vptr_VDetector[7])(xPos_mm,yPos_mm,this->fdetector->TopDrift * 0.5,&local_28);
  __x = (1.0 - local_28._M_impl.super__Vector_impl_data._M_start[1]) * A_top;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  dVar9 = SQRT(yPos_mm * yPos_mm + xPos_mm * xPos_mm);
  dVar8 = this->fdetector->PosResBase;
  dVar5 = exp(this->fdetector->PosResExp * dVar9);
  if (__x < 0.0) {
    dVar6 = sqrt(__x);
  }
  else {
    dVar6 = SQRT(__x);
  }
  pRVar2 = RandomGen::rndm();
  dVar7 = RandomGen::rand_uniform(pRVar2);
  pRVar2 = RandomGen::rndm();
  uVar4 = -(ulong)(150.0 < dVar9);
  dVar6 = (double)(uVar4 & 0x405d000000000000 | ~uVar4 & (ulong)(dVar8 + dVar5)) / dVar6;
  dVar8 = RandomGen::rand_gauss(pRVar2,0.0,SQRT(dVar6 * dVar6 + 9.0),false);
  auVar10._0_8_ = ABS(dVar8);
  dVar5 = cos(dVar7 * 6.283185307179586);
  dVar9 = sin(dVar7 * 6.283185307179586);
  auVar10._8_4_ = SUB84(auVar10._0_8_,0);
  auVar10._12_4_ = (int)((ulong)auVar10._0_8_ >> 0x20);
  dVar5 = dVar5 * auVar10._0_8_;
  dVar9 = dVar9 * auVar10._8_8_;
  if (((((100.0 < auVar10._0_8_) || (dVar8 == 0.0)) || (100.0 < ABS(dVar5))) || (100.0 < ABS(dVar9))
      ) && (40.0 < __x)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "WARNING: your position resolution is worse than 10 cm. Is that correct?!"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Setting resolution to perfect, for the current event.");
    std::endl<char,std::char_traits<char>>(poVar3);
    dVar5 = 0.0;
    dVar9 = 0.0;
  }
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar1 = xPos_mm + dVar5;
  pdVar1[1] = yPos_mm + dVar9;
  return __return_storage_ptr__;
}

Assistant:

vector<double> NESTcalc::xyResolution(double xPos_mm, double yPos_mm,
                                      double A_top) {
  vector<double> xySmeared(2);
  A_top *= 1. - fdetector->FitTBA(xPos_mm, yPos_mm,
                                  fdetector->get_TopDrift() / 2.)[1];

  double rad = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));
  double kappa = fdetector->get_PosResBase() +
                 exp(fdetector->get_PosResExp() * rad);  // arXiv:1710.02752
  if (rad > 150.)
    kappa = 116.;  // see git issue #131 from Claudio: but, converted from cm to
                   // mm here
  double sigmaR = kappa / sqrt(A_top);  // ibid. But only stat; add syst (~3mm)
  sigmaR = sqrt(sigmaR * sigmaR +
                9.);  // σ_vertex^2 = ((r_vertex/r_S2)*σ_(x,y))^2 + σ_sys^2

  double phi = two_PI * RandomGen::rndm()->rand_uniform();
  sigmaR = std::abs(RandomGen::rndm()->rand_gauss(0.0, sigmaR, false));
  double sigmaX = sigmaR * cos(phi);
  double sigmaY = sigmaR * sin(phi);

  if (sigmaR > 1e2 || std::isnan(sigmaR) || sigmaR <= 0. ||
      std::abs(sigmaX) > 1e2 || std::abs(sigmaY) > 1e2) {
    if (A_top >
        40.) {  // roughly three S2 e-'s in most detectors (or ~1.5 in LZ)
      cerr << "WARNING: your position resolution is worse than 10 cm. Is that "
              "correct?!"
           << endl;
      cerr << "Setting resolution to perfect, for the current event." << endl;
      sigmaX = 0.;
      sigmaY = 0.;
    }  // this is only a problem if the area is large and the res is still bad
  }

  xySmeared[0] = xPos_mm + sigmaX;
  xySmeared[1] = yPos_mm + sigmaY;

  return xySmeared;  // new X and Y position in mm with empirical smearing. LUX
                     // Run03 example
}